

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_api.c
# Opt level: O0

MPP_RET avsd_control(void *decoder,MpiCmd cmd_type,void *param)

{
  AvsdCtx_t *p_dec;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_type_local;
  void *decoder_local;
  
  if ((avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","In.","avsd_control");
  }
  if (cmd_type == MPP_DEC_SET_DISABLE_ERROR) {
    *(undefined4 *)((long)decoder + 0x184) = *param;
  }
  else if (cmd_type == MPP_DEC_SET_DIS_ERR_CLR_MARK) {
    *(undefined4 *)((long)decoder + 0x188) = *param;
  }
  if ((avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","Out.","avsd_control");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET avsd_control(void *decoder, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdCtx_t *p_dec = (AvsdCtx_t *)decoder;

    AVSD_PARSE_TRACE("In.");

    switch (cmd_type) {
    case MPP_DEC_SET_DISABLE_ERROR: {
        p_dec->disable_error = *((RK_U32 *)param);
    } break;
    case MPP_DEC_SET_DIS_ERR_CLR_MARK: {
        p_dec->dis_err_clr_mark = *((RK_U32 *)param);
    } break;
    default : {
    } break;
    }

    AVSD_PARSE_TRACE("Out.");
    return ret = MPP_OK;
}